

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O0

Sprite __thiscall nesvis::PpuHelper::get_sprite(PpuHelper *this,uint8_t sprite_index)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  IPpu *pIVar5;
  byte bVar6;
  uint8_t palette;
  bool front_of_bkg;
  bool flip_horizontally;
  bool flip_vertically;
  uint8_t x;
  uint8_t attribute;
  uint8_t tile_index;
  uint8_t y;
  uint8_t oam_addr;
  uint16_t kOamData;
  uint16_t kOamAddr;
  uint8_t sprite_index_local;
  PpuHelper *this_local;
  
  bVar6 = sprite_index * '\x04';
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)bVar6);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  iVar1 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(byte)(bVar6 + 1));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  iVar2 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(byte)(bVar6 + 2));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  uVar3 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(byte)(bVar6 + 3));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  iVar4 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  return (Sprite)(CONCAT17((uVar3 & 0x80) != 0,
                           CONCAT16((uVar3 & 0x40) != 0,
                                    CONCAT15((uVar3 & 0x20) != 0,
                                             CONCAT14((char)uVar3,
                                                      CONCAT13((char)uVar3,
                                                               CONCAT12((char)iVar2,
                                                                        CONCAT11((char)iVar1,
                                                                                 (char)iVar4)))))))
                 & 0xffffff03ffffffff);
}

Assistant:

PpuHelper::Sprite PpuHelper::get_sprite(uint8_t sprite_index) {
    constexpr uint16_t kOamAddr = 0x2003;
    constexpr uint16_t kOamData = 0x2004;
    const uint8_t oam_addr = sprite_index * 4u;

    nes_->ppu().write_byte(kOamAddr, oam_addr);
    const uint8_t y = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 1u);
    const uint8_t tile_index = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 2u);
    const uint8_t attribute = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 3u);
    const uint8_t x = nes_->ppu().read_byte(kOamData);

    const bool flip_vertically = attribute & 0b1000'0000u;
    const bool flip_horizontally = attribute & 0b0100'0000u;
    const bool front_of_bkg = attribute & 0b0010'0000u;
    const uint8_t palette = attribute & 0b0000'0011u;

    return {.x = x,
            .y = y,
            .tile_index = tile_index,
            .attribute = attribute,
            .palette = palette,
            .front_of_bkg = front_of_bkg,
            .flip_horizontally = flip_horizontally,
            .flip_vertically = flip_vertically};
}